

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.h
# Opt level: O1

void emitter_json_kv(emitter_t *emitter,char *json_key,emitter_type_t value_type,void *value)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  
  if (emitter->output == emitter_output_json) {
    if (emitter->emitted_key == true) {
      emitter->emitted_key = false;
    }
    else {
      pcVar2 = "";
      if (emitter->item_at_depth != false) {
        pcVar2 = ",";
      }
      emitter_printf(emitter,"%s\n",pcVar2);
      pcVar2 = "\t";
      if (emitter->output != emitter_output_json) {
        pcVar2 = " ";
      }
      if (0 < emitter->nesting_depth) {
        iVar1 = emitter->nesting_depth << (emitter->output != emitter_output_json);
        iVar3 = 1;
        if (1 < iVar1) {
          iVar3 = iVar1;
        }
        do {
          emitter_printf(emitter,"%s",pcVar2);
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
    }
    emitter_printf(emitter,"\"%s\": ",json_key);
    emitter->emitted_key = true;
  }
  if (emitter->output == emitter_output_json) {
    if (emitter->emitted_key == true) {
      emitter->emitted_key = false;
    }
    else {
      pcVar2 = "";
      if (emitter->item_at_depth != false) {
        pcVar2 = ",";
      }
      emitter_printf(emitter,"%s\n",pcVar2);
      pcVar2 = "\t";
      if (emitter->output != emitter_output_json) {
        pcVar2 = " ";
      }
      if (0 < emitter->nesting_depth) {
        iVar1 = emitter->nesting_depth << (emitter->output != emitter_output_json);
        iVar3 = 1;
        if (1 < iVar1) {
          iVar3 = iVar1;
        }
        do {
          emitter_printf(emitter,"%s",pcVar2);
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
    }
    emitter_print_value(emitter,emitter_justify_none,-1,value_type,value);
    emitter->item_at_depth = true;
  }
  return;
}

Assistant:

static inline void
emitter_json_kv(emitter_t *emitter, const char *json_key,
    emitter_type_t value_type, const void *value) {
	emitter_json_key(emitter, json_key);
	emitter_json_value(emitter, value_type, value);
}